

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

void __thiscall fasttext::Args::printQuantizationHelp(Args *this)

{
  ostream *poVar1;
  char *pcVar2;
  string sStack_78;
  string local_58;
  string local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "\nThe following arguments for quantization are optional:\n");
  poVar1 = std::operator<<(poVar1,"  -cutoff             number of words and ngrams to retain [");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"]\n");
  pcVar2 = "  -retrain            whether embeddings are finetuned if a cutoff is applied [";
  poVar1 = std::operator<<(poVar1,
                           "  -retrain            whether embeddings are finetuned if a cutoff is applied ["
                          );
  boolToString_abi_cxx11_(&local_38,(Args *)pcVar2,this->retrain);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"]\n");
  pcVar2 = "  -qnorm              whether the norm is quantized separately [";
  poVar1 = std::operator<<(poVar1,"  -qnorm              whether the norm is quantized separately ["
                          );
  boolToString_abi_cxx11_(&local_58,(Args *)pcVar2,this->qnorm);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,"]\n");
  pcVar2 = "  -qout               whether the classifier is quantized [";
  poVar1 = std::operator<<(poVar1,"  -qout               whether the classifier is quantized [");
  boolToString_abi_cxx11_(&sStack_78,(Args *)pcVar2,this->qout);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_78);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -dsub               size of each sub-vector [");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"]\n");
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Args::printQuantizationHelp() {
  std::cerr
      << "\nThe following arguments for quantization are optional:\n"
      << "  -cutoff             number of words and ngrams to retain ["
      << cutoff << "]\n"
      << "  -retrain            whether embeddings are finetuned if a cutoff is applied ["
      << boolToString(retrain) << "]\n"
      << "  -qnorm              whether the norm is quantized separately ["
      << boolToString(qnorm) << "]\n"
      << "  -qout               whether the classifier is quantized ["
      << boolToString(qout) << "]\n"
      << "  -dsub               size of each sub-vector [" << dsub << "]\n";
}